

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmFunctionCall(ExpressionContext *ctx,VmModule *module,ExprFunctionCall *node)

{
  VmInstructionType cmd;
  TypeBase *type;
  Allocator *pAVar1;
  VariableData *pVVar2;
  SynBase *source;
  ExprBase *expression;
  bool bVar3;
  int iVar4;
  VmValue *argument;
  VmConstant *pVVar5;
  undefined4 extraout_var;
  VmInstruction *argument_00;
  VmInstruction *this_00;
  VmValue **ppVVar6;
  IntrusiveList<ExprBase> *pIVar7;
  VmInstruction *argument_01;
  VmValue *pVVar8;
  VmValue *argument_02;
  uint resSize;
  IntrusiveList<ExprBase> *pIVar9;
  VmType VVar10;
  uint uniqueId;
  undefined4 in_stack_ffffffffffffff9c;
  VmConstant *reference;
  VmConstant *this;
  undefined4 extraout_var_00;
  
  argument = CompileVm(ctx,module,node->function);
  if (module->currentBlock == (VmBlock *)0x0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe7d,
                  "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
                 );
  }
  type = (node->super_ExprBase).type;
  if (type->size < 0x41) {
    argument_00 = (VmInstruction *)CreateConstantInt(ctx->allocator,(node->super_ExprBase).source,0)
    ;
  }
  else {
    pVVar5 = anon_unknown.dwarf_11cad6::CreateAlloca
                       (ctx,module,(node->super_ExprBase).source,type,"spill",true);
    iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var,iVar4);
    pAVar1 = ctx->allocator;
    VVar10 = GetVmType(ctx,(node->super_ExprBase).type);
    VmConstant::VmConstant(this,pAVar1,VVar10,(node->super_ExprBase).source);
    this->iValue = pVVar5->iValue;
    pVVar2 = pVVar5->container;
    this->container = pVVar2;
    this->isReference = true;
    reference = this;
    SmallArray<VmConstant_*,_8U>::push_back(&pVVar2->users,&reference);
    argument_00 = (VmInstruction *)reference;
  }
  iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
  this_00 = (VmInstruction *)CONCAT44(extraout_var_00,iVar4);
  pAVar1 = module->allocator;
  VVar10 = GetVmType(ctx,(node->super_ExprBase).type);
  source = (node->super_ExprBase).source;
  uniqueId = module->currentFunction->nextInstructionId;
  module->currentFunction->nextInstructionId = uniqueId + 1;
  VmInstruction::VmInstruction(this_00,pAVar1,VVar10,source,VM_INST_CALL,uniqueId);
  if ((((argument == (VmValue *)0x0) || (argument->typeID != 2)) ||
      (*(int *)&argument[1]._vptr_VmValue != 0x49)) ||
     ((argument->type).type != VM_TYPE_FUNCTION_REF)) {
    pVVar8 = (VmValue *)0x0;
    argument_02 = (VmValue *)0x0;
  }
  else {
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[]
                        ((SmallArray<VmValue_*,_4U> *)&argument[1].typeID,0);
    argument_02 = *ppVVar6;
    ppVVar6 = SmallArray<VmValue_*,_4U>::operator[]
                        ((SmallArray<VmValue_*,_4U> *)&argument[1].typeID,1);
    pVVar8 = *ppVVar6;
    if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 4)) {
      pVVar8 = (VmValue *)0x0;
    }
  }
  resSize = (pVVar8 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) | 2;
  pIVar9 = &node->arguments;
  for (pIVar7 = pIVar9; pIVar7->head != (ExprBase *)0x0;
      pIVar7 = (IntrusiveList<ExprBase> *)&pIVar7->head->next) {
    resSize = resSize + 1;
  }
  SmallArray<VmValue_*,_4U>::reserve(&this_00->arguments,resSize);
  if (pVVar8 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) {
    VmInstruction::AddArgument(this_00,argument_02);
    argument = pVVar8;
  }
  VmInstruction::AddArgument(this_00,argument);
  VmInstruction::AddArgument(this_00,&argument_00->super_VmValue);
  while( true ) {
    expression = pIVar9->head;
    if (expression == (ExprBase *)0x0) {
      cmd = this_00->cmd;
      bVar3 = anon_unknown.dwarf_11cad6::HasSideEffects(cmd);
      (this_00->super_VmValue).hasSideEffects = bVar3;
      bVar3 = anon_unknown.dwarf_11cad6::HasMemoryAccess(cmd);
      (this_00->super_VmValue).hasMemoryAccess = bVar3;
      VmBlock::AddInstruction(module->currentBlock,this_00);
      if (0x40 < ((node->super_ExprBase).type)->size) {
        this_00 = argument_00;
      }
      anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,&this_00->super_VmValue);
      return &this_00->super_VmValue;
    }
    argument_01 = (VmInstruction *)CompileVm(ctx,module,expression);
    if ((argument_01->super_VmValue).type.size == 0 &&
        (argument_01->super_VmValue).type.type == VM_TYPE_VOID) break;
    if (expression->type == ctx->typeFloat) {
      argument_01 = anon_unknown.dwarf_11cad6::CreateInstruction
                              ((anon_unknown_dwarf_11cad6 *)module,
                               (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                               (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument_01,
                               (VmValue *)CONCAT44(in_stack_ffffffffffffff9c,uniqueId));
    }
    VmInstruction::AddArgument(this_00,&argument_01->super_VmValue);
    pIVar9 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xebd,
                "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
               );
}

Assistant:

VmValue* CompileVmFunctionCall(ExpressionContext &ctx, VmModule *module, ExprFunctionCall *node)
{
	VmValue *function = CompileVm(ctx, module, node->function);

	assert(module->currentBlock);

	VmValue *resultTarget = NULL;

	if(node->type->size > spillTypeSize)
	{
		VmConstant *spill = CreateAlloca(ctx, module, node->source, node->type, "spill", true);

		VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, node->type), node->source);

		reference->iValue = spill->iValue;
		reference->container = spill->container;
		reference->isReference = true;

		reference->container->users.push_back(reference);

		resultTarget = reference;
	}
	else
	{
		resultTarget = CreateConstantInt(ctx.allocator, node->source, 0);
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_CALL, module->currentFunction->nextInstructionId++);

	// Inline call target for instruction without context
	VmValue *functionContext = NULL;
	VmFunction *functionId = NULL;

	if(VmInstruction *target = getType<VmInstruction>(function))
	{
		if(target->cmd == VM_INST_CONSTRUCT && target->type.type == VM_TYPE_FUNCTION_REF)
		{
			functionContext = target->arguments[0];
			functionId = getType<VmFunction>(target->arguments[1]);
		}
	}

	unsigned argCount = 2;

	if(functionContext && functionId)
		argCount++;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
		argCount++;

	inst->arguments.reserve(argCount);

	if(functionContext && functionId)
	{
		inst->AddArgument(functionContext);
		inst->AddArgument(functionId);
	}
	else
	{
		inst->AddArgument(function);
	}

	inst->AddArgument(resultTarget);

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		VmValue *argument = CompileVm(ctx, module, value);

		assert(argument->type != VmType::Void);

		if(value->type == ctx.typeFloat)
			argument = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, argument);

		inst->AddArgument(argument);
	}

	inst->hasSideEffects = HasSideEffects(inst->cmd);
	inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

	module->currentBlock->AddInstruction(inst);

	if(node->type->size > spillTypeSize)
		return CheckType(ctx, node, resultTarget);

	return CheckType(ctx, node, inst);
}